

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_abc_fwd(jit_State *J)

{
  ushort uVar1;
  IRIns *pIVar2;
  IRIns *pIVar3;
  IRIns *ir;
  IRRef lim;
  IRRef ref;
  IRIns *add2;
  jit_State *J_local;
  
  if (((((J->flags & 0x800000) != 0) && ((J->fold).right.field_0.op2 < 0x8000)) &&
      (pIVar2 = (J->cur).ir + (J->fold).right.field_0.op1, (pIVar2->field_1).o == '(')) &&
     (((pIVar2->field_0).op2 < 0x8000 &&
      ((J->cur).ir[(J->fold).right.field_0.op2].field_1.op12 ==
       -(J->cur).ir[(pIVar2->field_0).op2].field_1.op12)))) {
    uVar1 = J->chain[10];
    lim = (IRRef)(pIVar2->field_0).op1;
    if (lim < (J->fold).ins.field_0.op1) {
      lim = (IRRef)(J->fold).ins.field_0.op1;
    }
    while (ref = (IRRef)uVar1, lim < ref) {
      pIVar3 = (J->cur).ir + ref;
      if (((pIVar3->field_0).op1 == (J->fold).ins.field_0.op1) &&
         ((pIVar3->field_0).op2 == (pIVar2->field_0).op1)) {
        return 4;
      }
      uVar1 = (pIVar3->field_0).prev;
    }
  }
  return 0;
}

Assistant:

LJFOLD(ABC any ADD)
LJFOLDF(abc_fwd)
{
  if (LJ_LIKELY(J->flags & JIT_F_OPT_ABC)) {
    if (irref_isk(fright->op2)) {
      IRIns *add2 = IR(fright->op1);
      if (add2->o == IR_ADD && irref_isk(add2->op2) &&
	  IR(fright->op2)->i == -IR(add2->op2)->i) {
	IRRef ref = J->chain[IR_ABC];
	IRRef lim = add2->op1;
	if (fins->op1 > lim) lim = fins->op1;
	while (ref > lim) {
	  IRIns *ir = IR(ref);
	  if (ir->op1 == fins->op1 && ir->op2 == add2->op1)
	    return DROPFOLD;
	  ref = ir->prev;
	}
      }
    }
  }
  return NEXTFOLD;
}